

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,NamedMDNode *md)

{
  uint uVar1;
  String *ts;
  MDNode *md_00;
  uint index;
  
  ts = NamedMDNode::getName_abi_cxx11_(md);
  append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[6]>
            (this,(char (*) [2])0x1a7929,ts,(char (*) [6])" = !{");
  index = 0;
  while( true ) {
    uVar1 = NamedMDNode::getNumOperands(md);
    if (uVar1 <= index) break;
    md_00 = NamedMDNode::getOperand(md,index);
    append(this,md_00,false);
    index = index + 1;
    uVar1 = NamedMDNode::getNumOperands(md);
    if (index < uVar1) {
      std::operator<<((ostream *)this,", ");
    }
  }
  std::operator<<((ostream *)this,"}");
  return;
}

Assistant:

void StreamState::append(NamedMDNode *md)
{
	append("!", md->getName(), " = !{");
	for (unsigned i = 0; i < md->getNumOperands(); i++)
	{
		append(md->getOperand(i), false);
		if (i + 1 < md->getNumOperands())
			append(", ");
	}

	append("}");
}